

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

void m68k_release(void *ctx)

{
  long lVar1;
  CPUTLBDescFast *fast;
  CPUTLBDesc_conflict *desc;
  CPUTLBDescFast *f;
  CPUTLBDesc_conflict *d;
  M68kCPU *cpu;
  TCGContext_conflict2 *tcg_ctx;
  int i;
  void *ctx_local;
  
  lVar1 = *(long *)(*(long *)((long)ctx + 0x8970) + 0x1a0);
  release_common(ctx);
  for (tcg_ctx._4_4_ = 0; tcg_ctx._4_4_ < 2; tcg_ctx._4_4_ = tcg_ctx._4_4_ + 1) {
    g_free(*(gpointer *)(lVar1 + (long)tcg_ctx._4_4_ * 0x2b0 + 0x8488));
    g_free(*(gpointer *)(lVar1 + (long)tcg_ctx._4_4_ * 0x10 + 0x8748));
  }
  return;
}

Assistant:

static void m68k_release(void *ctx)
{
    int i;
    TCGContext *tcg_ctx = (TCGContext *)ctx;
    M68kCPU *cpu = (M68kCPU *)tcg_ctx->uc->cpu;
    CPUTLBDesc *d = cpu->neg.tlb.d;
    CPUTLBDescFast *f = cpu->neg.tlb.f;
    CPUTLBDesc *desc;
    CPUTLBDescFast *fast;

    release_common(ctx);
    for (i = 0; i < NB_MMU_MODES; i++) {
        desc = &(d[i]);
        fast = &(f[i]);
        g_free(desc->iotlb);
        g_free(fast->table);
    }
}